

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmSqrCrand(word *b,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  long in_RDX;
  word *in_RDI;
  word *prod;
  
  zzSqr(b,a,(size_t)r,stack);
  zzRedCrand((word *)r,(word *)stack,(size_t)prod,in_RDI);
  wwCopy(in_RDI,in_RCX,*(size_t *)(in_RDX + 0x30));
  return;
}

Assistant:

static void zmSqrCrand(word b[], const word a[], const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = prod + 2 * r->n;
	zzSqr(prod, a, r->n, stack);
	zzRedCrand(prod, r->mod, r->n, stack);
	wwCopy(b, prod, r->n);
}